

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O3

CURLcode pop3_statemach_act(connectdata *conn)

{
  anon_union_264_9_0449b319_for_proto *pp;
  uint *puVar1;
  byte *pbVar2;
  curl_usessl cVar3;
  int *piVar4;
  _Bool _Var5;
  CURLcode CVar6;
  CURLcode CVar7;
  imapstate iVar8;
  size_t sVar9;
  long lVar10;
  char *__dest;
  long lVar11;
  long lVar12;
  uint uVar13;
  curl_socket_t sockfd;
  char *pcVar14;
  SessionHandle *pSVar15;
  pop3_conn *pop3c;
  char *chlg64;
  char *mech;
  size_t len;
  pop3state state1;
  int pop3code;
  size_t nread;
  char *local_68;
  char *local_60;
  char *local_58;
  pop3state local_4c;
  size_t local_48;
  curl_socket_t local_40;
  uint local_3c;
  size_t local_38;
  
  sockfd = conn->sock[0];
  local_38 = 0;
  if ((conn->proto).imapc.state == IMAP_UPGRADETLS) {
    return CURLE_NOT_BUILT_IN;
  }
  pp = &conn->proto;
  if ((conn->proto).ftpc.pp.sendleft != 0) {
    CVar6 = Curl_pp_flushsend(&(pp->ftpc).pp);
    return CVar6;
  }
  do {
    CVar6 = Curl_pp_readresp(sockfd,&(pp->ftpc).pp,(int *)&local_3c,&local_38);
    uVar13 = local_3c;
    if (CVar6 != CURLE_OK) {
      return CVar6;
    }
    if (local_3c == 0) {
      return CURLE_OK;
    }
    switch((conn->proto).imapc.state) {
    case IMAP_SERVERGREET:
      pSVar15 = conn->data;
      local_40 = sockfd;
      sVar9 = strlen((pSVar15->state).buffer);
      if (uVar13 != 0x2b) {
        Curl_failf(pSVar15,"Got unexpected pop3-server response");
        return CURLE_FTP_WEIRD_SERVER_REPLY;
      }
      if (((3 < sVar9) && (3 < sVar9 - 2)) && ((pSVar15->state).buffer[sVar9 - 2] == '>')) {
        pcVar14 = (pSVar15->state).buffer + 3;
        do {
          if (*pcVar14 == '<') {
            if (sVar9 != 4) {
              __dest = (char *)(*Curl_ccalloc)(1,sVar9 - 3);
              (conn->proto).imapc.mailbox_uidvalidity = __dest;
              if (__dest != (char *)0x0) {
                memcpy(__dest,pcVar14,sVar9 - 4);
                (conn->proto).imapc.mailbox_uidvalidity[sVar9 - 4] = '\0';
                pbVar2 = (byte *)((long)&conn->proto + 0x88);
                *pbVar2 = *pbVar2 | 2;
              }
            }
            break;
          }
          pcVar14 = pcVar14 + 1;
          sVar9 = sVar9 - 1;
        } while (sVar9 != 5);
      }
      (conn->proto).pop3c.authmechs = 0;
      (conn->proto).pop3c.authused = 0;
      (conn->proto).pop3c.tls_supported = false;
      CVar6 = Curl_pp_sendf(&(pp->ftpc).pp,"%s","CAPA");
      if (CVar6 != CURLE_OK) {
        return CVar6;
      }
      (conn->proto).imapc.state = IMAP_CAPABILITY;
      sockfd = local_40;
      goto LAB_0056b62e;
    case IMAP_CAPABILITY:
      pSVar15 = conn->data;
      pcVar14 = (pSVar15->state).buffer;
      sVar9 = strlen(pcVar14);
      if (uVar13 == 0x2b) {
        cVar3 = (pSVar15->set).use_ssl;
        if ((cVar3 != CURLUSESSL_NONE) && (conn->ssl[0].use == false)) {
          if ((conn->proto).pop3c.tls_supported == true) {
            CVar6 = Curl_pp_sendf(&(pp->ftpc).pp,"%s","STLS");
            if (CVar6 != CURLE_OK) {
              return CVar6;
            }
            (conn->proto).imapc.state = IMAP_STARTTLS;
            goto LAB_0056b62e;
          }
          if (cVar3 != CURLUSESSL_TRY) {
            Curl_failf(pSVar15,"STLS not supported.");
            return CURLE_USE_SSL_FAILED;
          }
        }
      }
      else {
        if (uVar13 == 0x2a) {
          if (3 < sVar9) {
            if (*(int *)pcVar14 == 0x534c5453) {
              (conn->proto).pop3c.tls_supported = true;
            }
            else if (*(int *)pcVar14 == 0x52455355) {
              pbVar2 = (byte *)((long)&conn->proto + 0x88);
              *pbVar2 = *pbVar2 | 1;
            }
            else if ((sVar9 != 4) &&
                    ((pSVar15->state).buffer[4] == ' ' && *(int *)pcVar14 == 0x4c534153)) {
              pbVar2 = (byte *)((long)&conn->proto + 0x88);
              *pbVar2 = *pbVar2 | 4;
              lVar10 = sVar9 - 5;
              if (lVar10 != 0) {
                pcVar14 = (pSVar15->state).buffer + 5;
LAB_0056afaf:
                do {
                  if (((ulong)(byte)*pcVar14 < 0x21) &&
                     ((0x100002600U >> ((ulong)(byte)*pcVar14 & 0x3f) & 1) != 0))
                  goto code_r0x0056afca;
                  lVar11 = 0;
                  do {
                    if (((ulong)(byte)pcVar14[lVar11] < 0x21) &&
                       (lVar12 = lVar11,
                       (0x100002600U >> ((ulong)(byte)pcVar14[lVar11] & 0x3f) & 1) != 0)) break;
                    lVar11 = lVar11 + 1;
                    lVar12 = lVar10;
                  } while (lVar10 != lVar11);
                  switch(lVar12) {
                  case 4:
                    if (*(int *)pcVar14 == 0x4d4c544e) {
                      uVar13 = 0x40;
                      goto LAB_0056b117;
                    }
                    break;
                  case 5:
                    if (pcVar14[4] == 0x4e && *(int *)pcVar14 == 0x49474f4c) {
                      uVar13 = 1;
                    }
                    else {
                      if (pcVar14[4] != 0x4e || *(int *)pcVar14 != 0x49414c50) break;
                      uVar13 = 2;
                    }
                    goto LAB_0056b117;
                  case 6:
                    if (*(short *)(pcVar14 + 4) == 0x4950 && *(int *)pcVar14 == 0x41535347) {
                      uVar13 = 0x10;
                      goto LAB_0056b117;
                    }
                    break;
                  case 7:
                    if (*(int *)(pcVar14 + 3) == 0x32485455 && *(int *)pcVar14 == 0x55414f58) {
                      uVar13 = 0x80;
                      goto LAB_0056b117;
                    }
                    break;
                  case 8:
                    if (*(long *)pcVar14 == 0x35444d2d4d415243) {
                      uVar13 = 4;
                    }
                    else {
                      if (*(long *)pcVar14 != 0x4c414e5245545845) break;
                      uVar13 = 0x20;
                    }
LAB_0056b117:
                    puVar1 = &(conn->proto).pop3c.authmechs;
                    *puVar1 = *puVar1 | uVar13;
                    break;
                  case 10:
                    if (*(short *)(pcVar14 + 8) == 0x3544 && *(long *)pcVar14 == 0x4d2d545345474944)
                    {
                      uVar13 = 8;
                      goto LAB_0056b117;
                    }
                  }
                  pcVar14 = pcVar14 + lVar12;
                  lVar10 = lVar10 - lVar12;
                } while (lVar10 != 0);
              }
            }
          }
          goto LAB_0056b62e;
        }
        pbVar2 = (byte *)((long)&conn->proto + 0x88);
        *pbVar2 = *pbVar2 | 1;
      }
      goto LAB_0056b433;
    case IMAP_STARTTLS:
      if (local_3c == 0x2b) {
        return CURLE_NOT_BUILT_IN;
      }
      if ((conn->data->set).use_ssl != CURLUSESSL_TRY) {
        Curl_failf(conn->data,"STARTTLS denied. %c",(ulong)local_3c);
        return CURLE_USE_SSL_FAILED;
      }
LAB_0056b433:
      CVar6 = pop3_perform_authentication(conn);
      break;
    default:
switchD_0056acb0_caseD_4:
      (conn->proto).imapc.state = IMAP_STOP;
      return CURLE_OK;
    case IMAP_AUTHENTICATE_PLAIN:
      pSVar15 = conn->data;
      local_60 = (char *)0x0;
      local_68 = (char *)0x0;
      if (local_3c == 0x2b) {
        CVar6 = Curl_sasl_create_plain_message
                          (pSVar15,conn->user,conn->passwd,&local_68,(size_t *)&local_60);
        goto LAB_0056b253;
      }
      pcVar14 = "Access denied. %c";
LAB_0056b3b6:
      local_60 = (char *)0x0;
      local_68 = (char *)0x0;
      Curl_failf(pSVar15,pcVar14,(ulong)local_3c);
      CVar6 = CURLE_LOGIN_DENIED;
      goto LAB_0056b3cb;
    case IMAP_AUTHENTICATE_LOGIN:
      pSVar15 = conn->data;
      local_60 = (char *)0x0;
      local_68 = (char *)0x0;
      if (local_3c != 0x2b) {
LAB_0056b29f:
        pcVar14 = "Access denied: %d";
        goto LAB_0056b3b6;
      }
      CVar6 = Curl_sasl_create_login_message(pSVar15,conn->user,&local_68,(size_t *)&local_60);
      if ((local_68 == (char *)0x0 || CVar6 != CURLE_OK) ||
         (CVar6 = Curl_pp_sendf(&(pp->ftpc).pp,"%s"), CVar6 != CURLE_OK)) goto LAB_0056b3cb;
      (conn->proto).imapc.state = IMAP_AUTHENTICATE_LOGIN_PASSWD;
      goto LAB_0056b297;
    case IMAP_AUTHENTICATE_LOGIN_PASSWD:
      pSVar15 = conn->data;
      local_60 = (char *)0x0;
      local_68 = (char *)0x0;
      if (local_3c != 0x2b) goto LAB_0056b29f;
      CVar6 = Curl_sasl_create_login_message(pSVar15,conn->passwd,&local_68,(size_t *)&local_60);
      goto LAB_0056b253;
    case IMAP_AUTHENTICATE_CRAMMD5:
      pSVar15 = conn->data;
      local_60 = (char *)0x0;
      local_68 = (char *)0x0;
      local_58 = (char *)0x0;
      local_48 = 0;
      if (local_3c == 0x2b) {
        pop3_get_message((pSVar15->state).buffer,&local_68);
        CVar6 = Curl_sasl_decode_cram_md5_message(local_68,&local_60,&local_48);
        if (CVar6 == CURLE_OK) {
          CVar6 = Curl_sasl_create_cram_md5_message
                            (pSVar15,local_60,conn->user,conn->passwd,&local_58,&local_48);
          if ((local_58 != (char *)0x0 && CVar6 == CURLE_OK) &&
             (CVar6 = Curl_pp_sendf(&(pp->ftpc).pp,"%s"), CVar6 == CURLE_OK)) {
            iVar8 = IMAP_AUTHENTICATE_FINAL;
            goto LAB_0056b5e4;
          }
        }
        else {
          CVar6 = Curl_pp_sendf(&(pp->ftpc).pp,"%s","*");
          if (CVar6 == CURLE_OK) {
            iVar8 = IMAP_AUTHENTICATE_CANCEL;
LAB_0056b5e4:
            (conn->proto).imapc.state = iVar8;
            CVar6 = CURLE_OK;
          }
        }
        pcVar14 = local_58;
        if (local_60 != (char *)0x0) {
          (*Curl_cfree)(local_60);
          local_60 = (char *)0x0;
          pcVar14 = local_58;
        }
        goto LAB_0056b60e;
      }
LAB_0056b390:
      local_58 = (char *)0x0;
      local_60 = (char *)0x0;
      local_68 = (char *)0x0;
      Curl_failf(pSVar15,"Access denied: %d",(ulong)local_3c);
LAB_0056b3a4:
      CVar6 = CURLE_LOGIN_DENIED;
      break;
    case IMAP_AUTHENTICATE_DIGESTMD5:
      pSVar15 = conn->data;
      local_60 = (char *)0x0;
      local_68 = (char *)0x0;
      local_58 = (char *)0x0;
      if (local_3c != 0x2b) goto LAB_0056b390;
      pop3_get_message((pSVar15->state).buffer,&local_60);
      CVar6 = Curl_sasl_create_digest_md5_message
                        (pSVar15,local_60,conn->user,conn->passwd,"pop",&local_68,
                         (size_t *)&local_58);
      if (CVar6 == CURLE_OK) {
        CVar6 = Curl_pp_sendf(&(pp->ftpc).pp,"%s",local_68);
        pcVar14 = local_68;
        if (CVar6 == CURLE_OK) {
          iVar8 = IMAP_AUTHENTICATE_DIGESTMD5_RESP;
          goto LAB_0056b5ab;
        }
      }
      else {
        pcVar14 = local_68;
        if ((CVar6 == CURLE_BAD_CONTENT_ENCODING) &&
           (CVar6 = Curl_pp_sendf(&(pp->ftpc).pp,"%s","*"), pcVar14 = local_68, CVar6 == CURLE_OK))
        {
          iVar8 = IMAP_AUTHENTICATE_CANCEL;
LAB_0056b5ab:
          (conn->proto).imapc.state = iVar8;
          CVar6 = CURLE_OK;
          pcVar14 = local_68;
        }
      }
LAB_0056b60e:
      if (pcVar14 == (char *)0x0) break;
      goto LAB_0056b613;
    case IMAP_AUTHENTICATE_DIGESTMD5_RESP:
      if (local_3c != 0x2b) goto LAB_0056b67c;
      CVar6 = Curl_pp_sendf(&(pp->ftpc).pp,"%s","");
      if (CVar6 != CURLE_OK) {
        return CVar6;
      }
      (conn->proto).imapc.state = IMAP_AUTHENTICATE_FINAL;
      goto LAB_0056b62e;
    case IMAP_AUTHENTICATE_XOAUTH2:
      pSVar15 = conn->data;
      local_60 = (char *)0x0;
      local_68 = (char *)0x0;
      if (local_3c != 0x2b) goto LAB_0056b29f;
      CVar6 = Curl_sasl_create_xoauth2_message
                        (pSVar15,conn->user,conn->xoauth2_bearer,&local_68,(size_t *)&local_60);
LAB_0056b253:
      if ((local_68 != (char *)0x0 && CVar6 == CURLE_OK) &&
         (CVar6 = Curl_pp_sendf(&(pp->ftpc).pp,"%s"), CVar6 == CURLE_OK)) {
        (conn->proto).imapc.state = IMAP_AUTHENTICATE_FINAL;
LAB_0056b297:
        CVar6 = CURLE_OK;
      }
LAB_0056b3cb:
      pcVar14 = local_68;
      if (local_68 != (char *)0x0) {
LAB_0056b613:
        (*Curl_cfree)(pcVar14);
      }
      break;
    case IMAP_AUTHENTICATE_CANCEL:
      pSVar15 = conn->data;
      local_60 = (char *)0x0;
      local_68 = (char *)0x0;
      local_58 = (char *)0x0;
      local_48 = local_48 & 0xffffffff00000000;
      local_4c = POP3_STOP;
      puVar1 = &(conn->proto).pop3c.authmechs;
      *puVar1 = *puVar1 ^ (conn->proto).pop3c.authused;
      CVar6 = pop3_calc_sasl_details
                        (conn,&local_60,&local_68,(size_t *)&local_58,(pop3state *)&local_48,
                         &local_4c);
      if (CVar6 == CURLE_OK) {
        if (local_60 != (char *)0x0) {
          CVar6 = pop3_perform_auth(conn,local_60,local_68,(size_t)local_58,(pop3state)local_48,
                                    local_4c);
          pcVar14 = local_68;
          goto LAB_0056b60e;
        }
        uVar13 = (conn->proto).pop3c.authtypes;
        if (((uVar13 & 2) == 0) || (((conn->proto).imapc.resptag[4] & 2U) == 0)) {
          if (((uVar13 & 1) == 0) || (((conn->proto).imapc.resptag[4] & 1U) == 0)) {
            Curl_failf(pSVar15,"Authentication cancelled");
            goto LAB_0056b3a4;
          }
          CVar6 = pop3_perform_user(conn);
        }
        else {
          CVar6 = pop3_perform_apop(conn);
        }
      }
      break;
    case IMAP_AUTHENTICATE_FINAL:
    case IMAP_LOGIN:
      if (local_3c == 0x2b) goto switchD_0056acb0_caseD_4;
LAB_0056b67c:
      pSVar15 = conn->data;
      pcVar14 = "Authentication failed: %d";
LAB_0056b6aa:
      Curl_failf(pSVar15,pcVar14,(ulong)local_3c);
      return CURLE_LOGIN_DENIED;
    case IMAP_LIST:
      if (local_3c != 0x2b) goto LAB_0056b6a0;
      pcVar14 = conn->passwd;
      if (pcVar14 == (char *)0x0) {
        pcVar14 = "";
      }
      CVar6 = Curl_pp_sendf(&(pp->ftpc).pp,"PASS %s",pcVar14);
      if (CVar6 != CURLE_OK) {
        return CVar6;
      }
      (conn->proto).imapc.state = IMAP_SELECT;
      goto LAB_0056b62e;
    case IMAP_SELECT:
      if (local_3c == 0x2b) goto switchD_0056acb0_caseD_4;
LAB_0056b6a0:
      pSVar15 = conn->data;
      pcVar14 = "Access denied. %c";
      goto LAB_0056b6aa;
    case IMAP_FETCH:
      CVar6 = CURLE_RECV_ERROR;
      if (local_3c == 0x2b) {
        pSVar15 = conn->data;
        piVar4 = (int *)(pSVar15->req).protop;
        (conn->proto).pop3c.eob = 2;
        (conn->proto).pop3c.strip = 2;
        CVar6 = CURLE_OK;
        if (*piVar4 == 0) {
          CVar6 = CURLE_OK;
          Curl_setup_transfer(conn,0,-1,false,(curl_off_t *)0x0,-1,(curl_off_t *)0x0);
          pcVar14 = (conn->proto).ftpc.pp.cache;
          if (pcVar14 != (char *)0x0) {
            if ((pSVar15->set).opt_no_body == false) {
              CVar7 = Curl_pop3_write(conn,pcVar14,(conn->proto).rtspc.rtp_bufsize);
              if (CVar7 != CURLE_OK) {
                return CVar7;
              }
              pcVar14 = (pp->ftpc).pp.cache;
              if (pcVar14 != (char *)0x0) goto LAB_0056ae31;
            }
            else {
LAB_0056ae31:
              (*Curl_cfree)(pcVar14);
              (pp->ftpc).pp.cache = (char *)0x0;
            }
            (conn->proto).ftpc.pp.cache_size = 0;
          }
        }
      }
      (conn->proto).imapc.state = IMAP_STOP;
    }
    if (CVar6 != CURLE_OK) {
      return CVar6;
    }
    if ((conn->proto).imapc.state == IMAP_STOP) {
      return CURLE_OK;
    }
LAB_0056b62e:
    _Var5 = Curl_pp_moredata(&(pp->ftpc).pp);
    if (!_Var5) {
      return CURLE_OK;
    }
  } while( true );
code_r0x0056afca:
  pcVar14 = pcVar14 + 1;
  lVar10 = lVar10 + -1;
  if (lVar10 == 0) goto LAB_0056b62e;
  goto LAB_0056afaf;
}

Assistant:

static CURLcode pop3_statemach_act(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  curl_socket_t sock = conn->sock[FIRSTSOCKET];
  int pop3code;
  struct pop3_conn *pop3c = &conn->proto.pop3c;
  struct pingpong *pp = &pop3c->pp;
  size_t nread = 0;

  /* Busy upgrading the connection; right now all I/O is SSL/TLS, not POP3 */
  if(pop3c->state == POP3_UPGRADETLS)
    return pop3_perform_upgrade_tls(conn);

  /* Flush any data that needs to be sent */
  if(pp->sendleft)
    return Curl_pp_flushsend(pp);

 do {
    /* Read the response from the server */
    result = Curl_pp_readresp(sock, pp, &pop3code, &nread);
    if(result)
      return result;

    if(!pop3code)
      break;

    /* We have now received a full POP3 server response */
    switch(pop3c->state) {
    case POP3_SERVERGREET:
      result = pop3_state_servergreet_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_CAPA:
      result = pop3_state_capa_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_STARTTLS:
      result = pop3_state_starttls_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_AUTH_PLAIN:
      result = pop3_state_auth_plain_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_AUTH_LOGIN:
      result = pop3_state_auth_login_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_AUTH_LOGIN_PASSWD:
      result = pop3_state_auth_login_password_resp(conn, pop3code,
                                                   pop3c->state);
      break;

#ifndef CURL_DISABLE_CRYPTO_AUTH
    case POP3_AUTH_CRAMMD5:
      result = pop3_state_auth_cram_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_AUTH_DIGESTMD5:
      result = pop3_state_auth_digest_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_AUTH_DIGESTMD5_RESP:
      result = pop3_state_auth_digest_resp_resp(conn, pop3code, pop3c->state);
      break;
#endif

#ifdef USE_NTLM
    case POP3_AUTH_NTLM:
      result = pop3_state_auth_ntlm_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_AUTH_NTLM_TYPE2MSG:
      result = pop3_state_auth_ntlm_type2msg_resp(conn, pop3code,
                                                  pop3c->state);
      break;
#endif

#if defined(USE_WINDOWS_SSPI)
    case POP3_AUTH_GSSAPI:
      result = pop3_state_auth_gssapi_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_AUTH_GSSAPI_TOKEN:
      result = pop3_state_auth_gssapi_token_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_AUTH_GSSAPI_NO_DATA:
      result = pop3_state_auth_gssapi_no_data_resp(conn, pop3code,
                                                   pop3c->state);
      break;
#endif

    case POP3_AUTH_XOAUTH2:
      result = pop3_state_auth_xoauth2_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_AUTH_CANCEL:
      result = pop3_state_auth_cancel_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_AUTH_FINAL:
      result = pop3_state_auth_final_resp(conn, pop3code, pop3c->state);
      break;

#ifndef CURL_DISABLE_CRYPTO_AUTH
    case POP3_APOP:
      result = pop3_state_apop_resp(conn, pop3code, pop3c->state);
      break;
#endif

    case POP3_USER:
      result = pop3_state_user_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_PASS:
      result = pop3_state_pass_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_COMMAND:
      result = pop3_state_command_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_QUIT:
      /* fallthrough, just stop! */
    default:
      /* internal error */
      state(conn, POP3_STOP);
      break;
    }
  } while(!result && pop3c->state != POP3_STOP && Curl_pp_moredata(pp));

  return result;
}